

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O3

int __thiscall
axl::sl::
Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
::copy(Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
       *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Hdr *dst_00;
  undefined8 uVar1;
  bool bVar2;
  AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>
  *end;
  EVP_PKEY_CTX *pEVar3;
  EVP_PKEY_CTX *pEVar4;
  EVP_PKEY_CTX *pEVar5;
  int iVar6;
  Ptr<void> shadow;
  Ptr<void> local_48;
  Ptr<void> local_38;
  EVP_PKEY_CTX *pEVar7;
  
  if (src == (EVP_PKEY_CTX *)0x0) {
    iVar6 = 0;
    Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>>
    ::
    setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>::Construct>
              ((Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>>
                *)this,0);
  }
  else {
    local_38.m_p = (void *)0x0;
    local_38.m_refCount = (RefCount *)0x0;
    dst_00 = (this->
             super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
             ).m_hdr;
    if (((dst_00 != (Hdr *)0x0) && (&dst_00->m_count <= dst)) &&
       (dst < (EVP_PKEY_CTX *)((long)&dst_00->m_count + (dst_00->super_BufHdr).m_bufferSize))) {
      local_48.m_p = (EVP_PKEY_CTX *)0x0;
      local_48.m_refCount = (RefCount *)0x0;
      rc::Ptr<void>::copy(&local_48,(EVP_PKEY_CTX *)dst_00,(EVP_PKEY_CTX *)dst_00);
      rc::Ptr<void>::copy(&local_38,(EVP_PKEY_CTX *)local_48.m_p,(EVP_PKEY_CTX *)local_48.m_refCount
                         );
      rc::Ptr<void>::clear(&local_48);
    }
    bVar2 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>>
            ::
            setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>::Construct>
                      ((Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>>
                        *)this,(size_t)src);
    pEVar7 = (EVP_PKEY_CTX *)0xffffffffffffffff;
    if (bVar2) {
      pEVar3 = (EVP_PKEY_CTX *)
               (this->
               super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
               ).m_p;
      pEVar7 = src;
      if ((pEVar3 < dst) || (dst + (long)src * 0x18 <= pEVar3)) {
        if (0 < (long)src) {
          pEVar5 = pEVar3 + (long)src * 0x18;
          do {
            *(undefined8 *)(pEVar3 + 0x10) = *(undefined8 *)(dst + 0x10);
            uVar1 = *(undefined8 *)(dst + 8);
            *(undefined8 *)pEVar3 = *(undefined8 *)dst;
            *(undefined8 *)(pEVar3 + 8) = uVar1;
            pEVar3 = pEVar3 + 0x18;
            dst = dst + 0x18;
          } while (pEVar3 < pEVar5);
        }
      }
      else if (0 < (long)src) {
        pEVar5 = pEVar3 + (long)src * 0x18;
        pEVar4 = dst + (long)src * 0x18;
        do {
          *(undefined8 *)(pEVar5 + -8) = *(undefined8 *)(pEVar4 + -8);
          uVar1 = *(undefined8 *)(pEVar4 + -0x10);
          *(undefined8 *)(pEVar5 + -0x18) = *(undefined8 *)(pEVar4 + -0x18);
          *(undefined8 *)(pEVar5 + -0x10) = uVar1;
          pEVar5 = pEVar5 + -0x18;
          pEVar4 = pEVar4 + -0x18;
        } while (pEVar3 < pEVar5);
      }
    }
    iVar6 = (int)pEVar7;
    rc::Ptr<void>::clear(&local_38);
  }
  return iVar6;
}

Assistant:

size_t
	copy(
		const T* p,
		size_t count
	) {
		if (count == 0) {
			clear();
			return 0;
		}

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			if (Details::IsSimple) {
				// for simple non-ctor-dtor types we can apply in-buffer shift

				T* end = (T*)this->m_hdr->getEnd();
				ASSERT(p + count <= end);

				this->m_p = (T*)p;
				this->m_count = count;
				return count;
			} else {
				shadow = this->m_hdr; // ensure we keep p intact
			}

		bool result = setCount(count);
		if (!result)
			return -1;

		Details::copy(this->m_p, p, count);
		return count;
	}